

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

bool __thiscall
metaf::VisibilityGroup::appendMeters(VisibilityGroup *this,string *group,IncompleteText next)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  Modifier MVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  if (group->_M_string_length == 4) {
    iVar3 = std::__cxx11::string::compare((char *)group);
    bVar2 = true;
    if (iVar3 == 0) {
      MVar6 = NONE;
      uVar4 = 0;
      uVar7 = 0;
      goto LAB_001a8aeb;
    }
    uVar7 = 0;
    if (3 < group->_M_string_length) {
      lVar8 = 0;
      do {
        cVar1 = (group->_M_dataplus)._M_p[lVar8];
        if ((byte)(cVar1 - 0x3aU) < 0xf6) {
          uVar5 = 0;
          uVar7 = 0;
          goto LAB_001a8ad9;
        }
        uVar5 = (uint)(byte)(cVar1 - 0x30) + (int)uVar7 * 10;
        uVar7 = (ulong)uVar5;
        lVar8 = lVar8 + 1;
      } while ((int)lVar8 != 4);
      uVar7 = 0x100000000;
LAB_001a8ad9:
      uVar7 = uVar5 | uVar7;
    }
    if ((uVar7 & 0x100000000) != 0) {
      bVar9 = (int)uVar7 == 9999;
      uVar4 = 0x100002710;
      if (!bVar9) {
        uVar4 = uVar7;
      }
      MVar6 = (uint)bVar9 * 2;
      uVar7 = uVar4 >> 0x20;
      uVar4 = uVar4 & 0xffffffff;
      goto LAB_001a8aeb;
    }
  }
  MVar6 = NONE;
  uVar4 = 0;
  uVar7 = 0;
  bVar2 = false;
LAB_001a8aeb:
  if ((bVar2) && (uVar7 != 0)) {
    (this->vis).distModifier = MVar6;
    (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_payload_base<unsigned_int>)(uVar7 << 0x20 | uVar4);
    (this->vis).distUnit = METERS;
    this->incompleteText = next;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool VisibilityGroup::appendMeters(const std::string & group, IncompleteText next) {
	const auto v = Distance::fromMeterString(group);
	if (!v.has_value()) return false;
	if (!v->isReported()) return false;
	vis = *v;
	incompleteText = next;
	return true;
}